

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetRelationshipNames
               (Prim *prim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out_rel_names,string *err)

{
  bool bVar1;
  Model *model;
  Xform *xform;
  Scope *scope;
  GeomMesh *mesh;
  ostream *poVar2;
  string local_a00 [32];
  string local_9e0;
  ostringstream local_9c0 [8];
  ostringstream ss_e_4;
  string local_848 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828 [39];
  allocator local_801;
  string local_800 [32];
  fmt local_7e0 [32];
  ostringstream local_7c0 [8];
  ostringstream ss_e_3;
  string local_640 [7];
  bool ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [39];
  allocator local_5f9;
  string local_5f8 [32];
  fmt local_5d8 [32];
  ostringstream local_5b8 [8];
  ostringstream ss_e_2;
  string local_438 [7];
  bool ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  fmt local_3d0 [32];
  ostringstream local_3b0 [8];
  ostringstream ss_e_1;
  string local_230 [7];
  bool ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  fmt local_1c8 [32];
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  bool ret;
  string *err_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_rel_names_local;
  Prim *prim_local;
  
  bVar1 = Prim::is<tinyusdz::Model>(prim);
  if (bVar1) {
    model = Prim::as<tinyusdz::Model>(prim);
    bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
                      (model,out_rel_names,false,true);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"GetRelationshipNames");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7d3);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1e8,"Failed to list up Property names of Prim type {}",&local_1e9);
      tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>(local_1c8,(string *)local_1e8,local_210);
      poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)local_1c8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_1c8);
      ::std::__cxx11::string::~string((string *)local_210);
      ::std::__cxx11::string::~string(local_1e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_230);
        ::std::__cxx11::string::~string(local_230);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      return false;
    }
  }
  else {
    bVar1 = Prim::is<tinyusdz::Xform>(prim);
    if (bVar1) {
      xform = Prim::as<tinyusdz::Xform>(prim);
      bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Xform>
                        (xform,out_rel_names,false,true);
      if (!bVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_3b0);
        poVar2 = ::std::operator<<((ostream *)local_3b0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetRelationshipNames");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7d4);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3f0,"Failed to list up Property names of Prim type {}",&local_3f1);
        tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_3d0,(string *)local_3f0,local_418);
        poVar2 = ::std::operator<<((ostream *)local_3b0,(string *)local_3d0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_3d0);
        ::std::__cxx11::string::~string((string *)local_418);
        ::std::__cxx11::string::~string(local_3f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_438);
          ::std::__cxx11::string::~string(local_438);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_3b0);
        return false;
      }
    }
    else {
      bVar1 = Prim::is<tinyusdz::Scope>(prim);
      if (bVar1) {
        scope = Prim::as<tinyusdz::Scope>(prim);
        bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Scope>
                          (scope,out_rel_names,false,true);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_5b8);
          poVar2 = ::std::operator<<((ostream *)local_5b8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetRelationshipNames");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7d5);
          ::std::operator<<(poVar2," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_5f8,"Failed to list up Property names of Prim type {}",&local_5f9);
          tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>(local_5d8,(string *)local_5f8,local_620);
          poVar2 = ::std::operator<<((ostream *)local_5b8,(string *)local_5d8);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)local_5d8);
          ::std::__cxx11::string::~string((string *)local_620);
          ::std::__cxx11::string::~string(local_5f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_640);
            ::std::__cxx11::string::~string(local_640);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_5b8);
          return false;
        }
      }
      else {
        bVar1 = Prim::is<tinyusdz::GeomMesh>(prim);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_9c0);
          poVar2 = ::std::operator<<((ostream *)local_9c0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetRelationshipNames");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7df);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_9c0,"TODO: Prim type ");
          Prim::type_name_abi_cxx11_(&local_9e0,prim);
          poVar2 = ::std::operator<<(poVar2,(string *)&local_9e0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)&local_9e0);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_a00);
            ::std::__cxx11::string::~string(local_a00);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_9c0);
          return false;
        }
        mesh = Prim::as<tinyusdz::GeomMesh>(prim);
        bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
                          (mesh,out_rel_names,false,true);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_7c0);
          poVar2 = ::std::operator<<((ostream *)local_7c0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetRelationshipNames");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7d6);
          ::std::operator<<(poVar2," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_800,"Failed to list up Property names of Prim type {}",&local_801);
          tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>(local_7e0,(string *)local_800,local_828);
          poVar2 = ::std::operator<<((ostream *)local_7c0,(string *)local_7e0);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)local_7e0);
          ::std::__cxx11::string::~string((string *)local_828);
          ::std::__cxx11::string::~string(local_800);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_801);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_848);
            ::std::__cxx11::string::~string(local_848);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_7c0);
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool GetRelationshipNames(const tinyusdz::Prim &prim,
                          std::vector<std::string> *out_rel_names,
                          std::string *err) {
#define GET_PRIM_RELATIONSHIP_NAMES(__ty)                                 \
  if (prim.is<__ty>()) {                                                  \
    auto ret = GetPrimPropertyNamesImpl(*prim.as<__ty>(), out_rel_names,  \
                                        false, true);                     \
    if (!ret) {                                                           \
      PUSH_ERROR_AND_RETURN(                                              \
          fmt::format("Failed to list up Property names of Prim type {}", \
                      value::TypeTraits<__ty>::type_name()));             \
    }                                                                     \
  } else

  GET_PRIM_RELATIONSHIP_NAMES(Model)
  GET_PRIM_RELATIONSHIP_NAMES(Xform)
  GET_PRIM_RELATIONSHIP_NAMES(Scope)
  GET_PRIM_RELATIONSHIP_NAMES(GeomMesh)
  // GET_PRIM_RELATIONSHIP_NAMES(GeomSubset)
  // GET_PRIM_RELATIONSHIP_NAMES(Shader)
  // GET_PRIM_RELATIONSHIP_NAMES(Material)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelRoot)
  // GET_PRIM_RELATIONSHIP_NAMES(BlendShape)
  // GET_PRIM_RELATIONSHIP_NAMES(Skeleton)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelAnimation)
  {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY_NAMES

  return true;
}